

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O3

int __thiscall
boost::deflate::inflate_stream_test::ZlibDecompressor::init
          (ZlibDecompressor *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  runtime_error *this_00;
  code *pcVar2;
  undefined *puVar3;
  
  inflateEnd(&this->zs);
  (this->zs).next_in = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_in = 0;
  (this->zs).total_in = 0;
  (this->zs).next_out = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_out = 0;
  (this->zs).total_out = 0;
  (this->zs).msg = (char *)0x0;
  (this->zs).state = (internal_state *)0x0;
  (this->zs).zalloc = (alloc_func)0x0;
  (this->zs).zfree = (free_func)0x0;
  (this->zs).opaque = (voidpf)0x0;
  *(undefined8 *)&(this->zs).data_type = 0;
  (this->zs).adler = 0;
  (this->zs).reserved = 0;
  iVar1 = inflateInit2_(&this->zs,-0xf,"1.2.11",0x70);
  if (iVar1 == -2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error((domain_error *)this_00,"zlib decompressor: bad arg");
    puVar3 = &std::domain_error::typeinfo;
    pcVar2 = std::domain_error::~domain_error;
  }
  else {
    if (iVar1 != -4) {
      return iVar1;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"zlib decompressor: no memory");
    puVar3 = &std::runtime_error::typeinfo;
    pcVar2 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar3,pcVar2);
}

Assistant:

void init() override {
            inflateEnd(&zs);
            zs = {};
            const auto res = inflateInit2(&zs, -15);
            switch(res){
            case Z_OK:
                break;
            case Z_MEM_ERROR:
                throw std::runtime_error{"zlib decompressor: no memory"};
            case Z_STREAM_ERROR:
                throw std::domain_error{"zlib decompressor: bad arg"};
            }
        }